

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode connect_SOCKS(Curl_easy *data,int sockindex,_Bool *done)

{
  connectdata *pcVar1;
  uint local_64;
  uint local_60;
  uint local_5c;
  char *local_58;
  char *local_50;
  char *local_48;
  int port;
  char *host;
  connectdata *conn;
  CURLproxycode pxresult;
  CURLcode result;
  _Bool *done_local;
  int sockindex_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  conn._0_4_ = CURLPX_OK;
  pcVar1 = data->conn;
  if ((*(uint *)&(pcVar1->bits).field_0x4 >> 1 & 1) == 0) {
    *done = true;
  }
  else {
    if ((*(uint *)&(pcVar1->bits).field_0x4 & 1) == 0) {
      if ((*(uint *)&(pcVar1->bits).field_0x4 >> 9 & 1) == 0) {
        if (sockindex == 1) {
          local_58 = pcVar1->secondaryhostname;
        }
        else {
          local_58 = (pcVar1->host).name;
        }
        local_50 = local_58;
      }
      else {
        local_50 = (pcVar1->conn_to_host).name;
      }
      local_48 = local_50;
    }
    else {
      local_48 = (pcVar1->http_proxy).host.name;
    }
    if ((*(uint *)&(pcVar1->bits).field_0x4 & 1) == 0) {
      if (sockindex == 1) {
        local_60 = (uint)pcVar1->secondary_port;
      }
      else {
        if ((*(uint *)&(pcVar1->bits).field_0x4 >> 10 & 1) == 0) {
          local_64 = pcVar1->remote_port;
        }
        else {
          local_64 = pcVar1->conn_to_port;
        }
        local_60 = local_64;
      }
      local_5c = local_60;
    }
    else {
      local_5c = (uint)(pcVar1->http_proxy).port;
    }
    switch((pcVar1->socks_proxy).proxytype) {
    case '\x04':
    case '\x06':
      conn._0_4_ = Curl_SOCKS4((pcVar1->socks_proxy).user,local_48,local_5c,sockindex,data,done);
      break;
    case '\x05':
    case '\a':
      conn._0_4_ = Curl_SOCKS5((pcVar1->socks_proxy).user,(pcVar1->socks_proxy).passwd,local_48,
                               local_5c,sockindex,data,done);
      break;
    default:
      Curl_failf(data,"unknown proxytype option given");
      conn._4_4_ = CURLE_COULDNT_CONNECT;
    }
    if ((CURLproxycode)conn != CURLPX_OK) {
      conn._4_4_ = CURLE_PROXY;
      (data->info).pxcode = (CURLproxycode)conn;
    }
  }
  return conn._4_4_;
}

Assistant:

static CURLcode connect_SOCKS(struct Curl_easy *data, int sockindex,
                              bool *done)
{
  CURLcode result = CURLE_OK;
#ifndef CURL_DISABLE_PROXY
  CURLproxycode pxresult = CURLPX_OK;
  struct connectdata *conn = data->conn;
  if(conn->bits.socksproxy) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    const char * const host =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    const int port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    switch(conn->socks_proxy.proxytype) {
    case CURLPROXY_SOCKS5:
    case CURLPROXY_SOCKS5_HOSTNAME:
      pxresult = Curl_SOCKS5(conn->socks_proxy.user, conn->socks_proxy.passwd,
                             host, port, sockindex, data, done);
      break;

    case CURLPROXY_SOCKS4:
    case CURLPROXY_SOCKS4A:
      pxresult = Curl_SOCKS4(conn->socks_proxy.user, host, port, sockindex,
                             data, done);
      break;

    default:
      failf(data, "unknown proxytype option given");
      result = CURLE_COULDNT_CONNECT;
    } /* switch proxytype */
    if(pxresult) {
      result = CURLE_PROXY;
      data->info.pxcode = pxresult;
    }
  }
  else
#else
    (void)data;
    (void)sockindex;
#endif /* CURL_DISABLE_PROXY */
    *done = TRUE; /* no SOCKS proxy, so consider us connected */

  return result;
}